

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O1

void VerifyMasterChain(AActor *self)

{
  TObjPtr<AActor> *pTVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  AActor *pAVar6;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *paVar7;
  bool bVar8;
  
  if (self != (AActor *)0x0) {
    pTVar1 = &self->master;
    pAVar3 = (self->master).field_0.p;
    pAVar5 = self;
    if ((pAVar3 != (AActor *)0x0) &&
       (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (pTVar1->field_0).p = (AActor *)0x0;
      pAVar3 = (AActor *)0x0;
    }
    do {
      if (pAVar3 == (AActor *)0x0) {
        return;
      }
      bVar8 = pAVar3 == self;
      pAVar4 = pAVar3;
      paVar7 = &pTVar1->field_0;
      if (bVar8) {
LAB_004682f3:
        paVar7->p = (AActor *)0x0;
      }
      else {
        pAVar6 = self;
        if (pAVar5 != self) {
          do {
            pAVar2 = (pAVar6->master).field_0.p;
            if ((pAVar2 != (AActor *)0x0) &&
               (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
              (pAVar6->master).field_0.p = (AActor *)0x0;
              pAVar2 = (AActor *)0x0;
            }
            pAVar6 = pAVar2;
            bVar8 = pAVar6 == pAVar3;
            if (bVar8) goto LAB_004682f3;
          } while (pAVar6 != pAVar5);
        }
        pAVar4 = (pAVar3->master).field_0.p;
        pAVar5 = pAVar3;
        if ((pAVar4 != (AActor *)0x0) &&
           (((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          pAVar4 = (AActor *)0x0;
          paVar7 = &(pAVar3->master).field_0;
          goto LAB_004682f3;
        }
      }
      pAVar3 = pAVar4;
    } while (!bVar8);
  }
  return;
}

Assistant:

void VerifyMasterChain(AActor *self)
{
	// See VerifyTargetChain for detailed comments.

	if (!self) return;
	AActor *origin = self;
	AActor *next = origin->master;
	while (next) // We always care (See "VerifyTargetChain")
	{
		AActor *compare = self;
		for (;;)
		{
			if (compare == next)
			{
				self->master = NULL;
				return;
			}
			if (compare == origin) break;
			compare = compare->master;
		}

		origin = next;
		next = next->master;
	}
}